

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O0

CFastSet<unsigned_int> * __thiscall
CFastSet<unsigned_int>::operator=(CFastSet<unsigned_int> *this,CFastSet<unsigned_int> *set)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint *puVar3;
  int local_1c;
  int i;
  CFastSet<unsigned_int> *set_local;
  CFastSet<unsigned_int> *this_local;
  
  if (this != set) {
    if (this->elementsSize != set->elementsSize) {
      if (this->elements != (uint *)0x0) {
        operator_delete__(this->elements);
      }
      this->elementsSize = set->elementsSize;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)this->elementsSize;
      uVar2 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      puVar3 = (uint *)operator_new__(uVar2);
      this->elements = puVar3;
    }
    for (local_1c = 0; local_1c < this->elementsSize; local_1c = local_1c + 1) {
      this->elements[local_1c] = set->elements[local_1c];
    }
  }
  return this;
}

Assistant:

CFastSet<T>& CFastSet<T>::operator=( const CFastSet& set )
{
	if( this != &set ) {
		if( elementsSize != set.elementsSize ) {
			delete[] elements;
			elementsSize = set.elementsSize;
			elements = new T[elementsSize];
		}
		for( int i = 0; i < elementsSize; i++ ) {
			elements[i] = set.elements[i];
		}
	}
	return *this;
}